

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

bool comparesEqual(QString *lhs,char *rhs)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView local_30;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = rhs;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_30,&local_20);
  bVar1 = comparesEqual(lhs,local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QString &lhs, const char *rhs) noexcept
    { return comparesEqual(lhs, QByteArrayView(rhs)); }